

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O0

SparseMatrix<double,_0,_int> * __thiscall
Eigen::SparseMatrix<double,_0,_int>::operator=
          (SparseMatrix<double,_0,_int> *this,SparseMatrix<double,_0,_int> *other)

{
  bool bVar1;
  SparseMatrix<double,_0,_int> *in_RSI;
  SparseMatrix<double,_0,_int> *in_RDI;
  SparseMatrix<double,_0,_int> *unaff_retaddr;
  SparseMatrix<double,_0,_int> *other_00;
  
  other_00 = in_RDI;
  bVar1 = SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>::isRValue
                    ((SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)in_RSI);
  if (bVar1) {
    SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>::const_cast_derived
              ((SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)in_RSI);
    swap(in_RSI,in_RDI);
  }
  else if (in_RDI != in_RSI) {
    SparseMatrix<double,0,int>::initAssignment<Eigen::SparseMatrix<double,0,int>>
              (unaff_retaddr,other_00);
    bVar1 = SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>::isCompressed
                      ((SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_> *)0x1e7805);
    if (bVar1) {
      internal::smart_copy<int>((int *)in_RSI,(int *)in_RDI,(int *)0x1e7839);
      internal::CompressedStorage<double,_int>::operator=
                ((CompressedStorage<double,_int> *)in_RSI,(CompressedStorage<double,_int> *)in_RDI);
    }
    else {
      SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>::operator=
                ((SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)unaff_retaddr,other_00);
    }
  }
  return in_RDI;
}

Assistant:

inline SparseMatrix& operator=(const SparseMatrix& other)
    {
      if (other.isRValue())
      {
        swap(other.const_cast_derived());
      }
      else if(this!=&other)
      {
        #ifdef EIGEN_SPARSE_CREATE_TEMPORARY_PLUGIN
          EIGEN_SPARSE_CREATE_TEMPORARY_PLUGIN
        #endif
        initAssignment(other);
        if(other.isCompressed())
        {
          internal::smart_copy(other.m_outerIndex, other.m_outerIndex + m_outerSize + 1, m_outerIndex);
          m_data = other.m_data;
        }
        else
        {
          Base::operator=(other);
        }
      }
      return *this;
    }